

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tls.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char *__nptr;
  char *p;
  int ret;
  char *in_stack_00000468;
  char *in_stack_00000470;
  
  OPENSSL_init_crypto(0x4c,0);
  __nptr = getenv("VERBOSE");
  if (__nptr != (char *)0x0) {
    verbose = atoi(__nptr);
  }
  uVar1 = test(in_stack_00000470,in_stack_00000468);
  cipher_list = "LEGACY-GOST2012-GOST8912-GOST8912";
  uVar2 = test(in_stack_00000470,in_stack_00000468);
  uVar3 = test(in_stack_00000470,in_stack_00000468);
  uVar4 = test(in_stack_00000470,in_stack_00000468);
  uVar5 = test(in_stack_00000470,in_stack_00000468);
  uVar6 = test(in_stack_00000470,in_stack_00000468);
  uVar7 = test(in_stack_00000470,in_stack_00000468);
  uVar8 = test(in_stack_00000470,in_stack_00000468);
  uVar8 = uVar8 | uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
  if (uVar8 == 0) {
    printf("\x1b[0;32m= All tests passed!\n\x1b[m");
  }
  else {
    printf("\x1b[0;31m= Some tests FAILED!\n\x1b[m");
  }
  return uVar8;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    OPENSSL_add_all_algorithms_conf();

    char *p;
    if ((p = getenv("VERBOSE")))
	verbose = atoi(p);

    ret |= test("rsa", NULL);
    cipher_list = "LEGACY-GOST2012-GOST8912-GOST8912";
    ret |= test("gost2012_256", "A");
    ret |= test("gost2012_256", "B");
    ret |= test("gost2012_256", "C");
    ret |= test("gost2012_256", "TCA");
    ret |= test("gost2012_512", "A");
    ret |= test("gost2012_512", "B");
    ret |= test("gost2012_512", "C");

    if (ret)
	printf(cDRED "= Some tests FAILED!\n" cNORM);
    else
	printf(cDGREEN "= All tests passed!\n" cNORM);
    return ret;
}